

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O0

vector<glcts::_vec2,_std::allocator<glcts::_vec2>_> * __thiscall
glcts::TessellationShaderQuadsInnerTessellationLevelRounding::
getUniqueTessCoordinatesFromVertexDataSet
          (vector<glcts::_vec2,_std::allocator<glcts::_vec2>_> *__return_storage_ptr__,
          TessellationShaderQuadsInnerTessellationLevelRounding *this,float *raw_data,
          uint n_raw_data_vertices)

{
  bool bVar1;
  __normal_iterator<glcts::_vec2_*,_std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>_>
  local_70;
  _vec2 *local_68;
  __normal_iterator<glcts::_vec2_*,_std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>_>
  local_60;
  __normal_iterator<glcts::_vec2_*,_std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>_>
  local_58 [3];
  _vec2 local_40;
  _vec2 vertex;
  float *vertex_data;
  uint n_vertex;
  uint n_raw_data_vertices_local;
  float *raw_data_local;
  TessellationShaderQuadsInnerTessellationLevelRounding *this_local;
  vector<glcts::_vec2,_std::allocator<glcts::_vec2>_> *result;
  
  std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::vector(__return_storage_ptr__);
  for (vertex_data._4_4_ = 0; vertex_data._4_4_ < n_raw_data_vertices;
      vertex_data._4_4_ = vertex_data._4_4_ + 2) {
    vertex = (_vec2)(raw_data + vertex_data._4_4_ * 3);
    _vec2::_vec2(&local_40,*(float *)vertex,*(float *)((long)vertex + 4));
    local_60._M_current =
         (_vec2 *)std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::begin
                            (__return_storage_ptr__);
    local_68 = (_vec2 *)std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::end
                                  (__return_storage_ptr__);
    local_58[0] = std::
                  find<__gnu_cxx::__normal_iterator<glcts::_vec2*,std::vector<glcts::_vec2,std::allocator<glcts::_vec2>>>,glcts::_vec2>
                            (local_60,(__normal_iterator<glcts::_vec2_*,_std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>_>
                                       )local_68,&local_40);
    local_70._M_current =
         (_vec2 *)std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::end
                            (__return_storage_ptr__);
    bVar1 = __gnu_cxx::operator==(local_58,&local_70);
    if (bVar1) {
      std::vector<glcts::_vec2,_std::allocator<glcts::_vec2>_>::push_back
                (__return_storage_ptr__,&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<_vec2> TessellationShaderQuadsInnerTessellationLevelRounding::getUniqueTessCoordinatesFromVertexDataSet(
	const float* raw_data, const unsigned int n_raw_data_vertices)
{
	std::vector<_vec2> result;

	for (unsigned int n_vertex = 0; n_vertex < n_raw_data_vertices; n_vertex += 2)
	{
		const float* vertex_data = raw_data + n_vertex * 3 /* components */;
		_vec2		 vertex(vertex_data[0], vertex_data[1]);

		if (std::find(result.begin(), result.end(), vertex) == result.end())
		{
			result.push_back(vertex);
		}

	} /* for (all vertices) */

	return result;
}